

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void nni_http_write_req(nng_http *conn,nni_aio *aio)

{
  uint local_5c;
  undefined1 auStack_58 [4];
  int niov;
  nni_iov iov [2];
  void *local_30;
  size_t bufsz;
  void *buf;
  nni_aio *pnStack_18;
  nng_err rv;
  nni_aio *aio_local;
  nng_http *conn_local;
  
  pnStack_18 = aio;
  aio_local = (nni_aio *)conn;
  buf._4_4_ = http_prepare(conn,(void **)&bufsz,(size_t *)&local_30);
  if (buf._4_4_ == NNG_OK) {
    if ((void *)bufsz != aio_local[4].a_inputs[0]) {
      nni_free(aio_local[2].a_cancel_arg,(size_t)aio_local[2].a_prov_data);
      aio_local[2].a_cancel_arg = (void *)bufsz;
      aio_local[2].a_prov_data = (void *)((long)local_30 + 1);
    }
    local_5c = 1;
    iov[0].iov_buf = local_30;
    _auStack_58 = (void *)bufsz;
    iov[1].iov_buf = (void *)aio_local[2].a_task.task_cv.cv.__data.__g1_start.__value64;
    iov[0].iov_len = aio_local[2].a_task.task_cv.cv.__align;
    if ((iov[1].iov_buf != (void *)0x0) && (iov[0].iov_len != 0)) {
      local_5c = 2;
    }
    nni_aio_set_iov(pnStack_18,local_5c,(nni_iov *)auStack_58);
    nni_mtx_lock(&aio_local[2].a_task.task_mtx);
    http_wr_submit((nni_http_conn *)aio_local,pnStack_18,HTTP_WR_REQ);
    nni_mtx_unlock(&aio_local[2].a_task.task_mtx);
  }
  else {
    nni_aio_finish_error(pnStack_18,buf._4_4_);
  }
  return;
}

Assistant:

void
nni_http_write_req(nng_http *conn, nni_aio *aio)
{
	nng_err rv;
	void   *buf;
	size_t  bufsz;
	nni_iov iov[2];
	int     niov;

	if ((rv = http_prepare(conn, &buf, &bufsz)) != 0) {
		nni_aio_finish_error(aio, rv);
		return;
	}
	if (buf != conn->buf) {
		nni_free(conn->req.data.buf, conn->req.data.bufsz);
		conn->req.data.buf   = buf;
		conn->req.data.bufsz = bufsz + 1; // including \0
	}
	niov           = 1;
	iov[0].iov_len = bufsz;
	iov[0].iov_buf = buf;
	iov[1].iov_len = conn->req.data.size;
	iov[1].iov_buf = conn->req.data.data;
	if ((iov[1].iov_len > 0) && (iov[1].iov_buf != NULL)) {
		niov++;
	}
	nni_aio_set_iov(aio, niov, iov);

	nni_mtx_lock(&conn->mtx);
	http_wr_submit(conn, aio, HTTP_WR_REQ);
	nni_mtx_unlock(&conn->mtx);
}